

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O3

QItemSelection * __thiscall
QListViewPrivate::selection
          (QItemSelection *__return_storage_ptr__,QListViewPrivate *this,QRect *rect)

{
  QWidgetData *pQVar1;
  LayoutDirection LVar2;
  ulong uVar3;
  undefined1 *puVar4;
  uint uVar5;
  long *plVar6;
  QCommonListViewBase *pQVar7;
  QModelIndex *pQVar8;
  int iVar9;
  long *plVar10;
  long in_FS_OFFSET;
  bool bVar11;
  int iVar12;
  QArrayData *local_98;
  long *plStack_90;
  undefined1 *local_88;
  QModelIndex local_78;
  QModelIndex local_58;
  undefined1 local_40 [16];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->super_QList<QItemSelectionRange>).d.d = (Data *)0x0;
  (__return_storage_ptr__->super_QList<QItemSelectionRange>).d.ptr = (QItemSelectionRange *)0x0;
  (__return_storage_ptr__->super_QList<QItemSelectionRange>).d.size = 0;
  local_58.r = -1;
  local_58.c = -1;
  local_58.i = 0;
  local_58.m.ptr = (QAbstractItemModel *)0x0;
  local_78.r = -1;
  local_78.c = -1;
  local_78.i = 0;
  local_78.m.ptr = (QAbstractItemModel *)0x0;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  local_98 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  plStack_90 = (long *)&DAT_aaaaaaaaaaaaaaaa;
  if (((this->super_QAbstractItemViewPrivate).delayedPendingLayout == true) &&
     ((this->super_QAbstractItemViewPrivate).state != CollapsingState)) {
    QAbstractItemViewPrivate::interruptDelayedItemsLayout(&this->super_QAbstractItemViewPrivate);
    (**(code **)(**(long **)&(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate
                             .super_QFramePrivate.super_QWidgetPrivate.field_0x8 + 0x220))();
  }
  LVar2 = QWidget::layoutDirection
                    (*(QWidget **)
                      &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                       super_QFramePrivate.super_QWidgetPrivate.field_0x8);
  local_40 = QRect::normalized();
  uVar3 = local_40._0_8_;
  if (LVar2 == RightToLeft) {
    pQVar1 = ((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)->
             data;
    iVar9 = ((pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i) + 1;
    pQVar7 = this->commonListView;
    iVar12 = (pQVar7->contentsSize).wd.m_i;
    if (iVar9 <= iVar12) {
      iVar9 = iVar12;
    }
    uVar5 = ~local_40._8_4_ + iVar9;
    local_40._8_8_ =
         (ulong)((local_40._8_4_ - local_40._0_4_) + uVar5) | local_40._8_8_ & 0xffffffff00000000;
    local_40._0_8_ = (ulong)uVar5 | uVar3 & 0xffffffff00000000;
  }
  else {
    pQVar7 = this->commonListView;
  }
  (*pQVar7->_vptr_QCommonListViewBase[7])(&local_98,pQVar7,local_40);
  if (local_88 != (undefined1 *)0x0) {
    puVar4 = local_88;
    plVar6 = plStack_90;
    plVar10 = plStack_90;
    do {
      if ((((local_58.r < 0) || ((long)local_58._0_8_ < 0)) ||
          (local_58.m.ptr == (QAbstractItemModel *)0x0)) &&
         (((local_78.r < 0 || ((long)local_78._0_8_ < 0)) ||
          (local_78.m.ptr == (QAbstractItemModel *)0x0)))) {
        local_78.m.ptr = (QAbstractItemModel *)plVar10[2];
        local_78._0_8_ = *plVar10;
        local_78.i = plVar10[1];
        local_58.r = (int)*plVar10;
        local_58.c = *(int *)((long)plVar10 + 4);
        iVar12 = (int)plVar10[1];
        iVar9 = *(int *)((long)plVar10 + 0xc);
        local_58.m.ptr = (QAbstractItemModel *)plVar10[2];
LAB_0056dcc0:
        local_58.i = CONCAT44(iVar9,iVar12);
      }
      else {
        if ((int)*plVar10 == local_58.r + -1) {
          local_58.m.ptr = (QAbstractItemModel *)plVar10[2];
          local_58.r = (int)*plVar10;
          local_58.c = *(int *)((long)plVar10 + 4);
          iVar12 = (int)plVar10[1];
          iVar9 = *(int *)((long)plVar10 + 0xc);
          goto LAB_0056dcc0;
        }
        if ((int)*plVar10 == local_78.r + 1) {
          local_78.m.ptr = (QAbstractItemModel *)plVar10[2];
          local_78._0_8_ = *plVar10;
          local_78.i = plVar10[1];
        }
        else {
          QItemSelection::select((QModelIndex *)__return_storage_ptr__,&local_58);
          local_78.m.ptr = (QAbstractItemModel *)plVar10[2];
          local_78._0_8_ = *plVar10;
          local_78.i = plVar10[1];
          local_58._0_8_ = *plVar10;
          local_58.i = plVar10[1];
          local_58.m.ptr = (QAbstractItemModel *)plVar10[2];
          puVar4 = local_88;
          plVar6 = plStack_90;
        }
      }
      plVar10 = plVar10 + 3;
    } while (plVar10 != plVar6 + (long)puVar4 * 3);
    bVar11 = (local_78.c | local_78.r) < 0;
    if (((local_58.r < 0) || ((long)local_58._0_8_ < 0)) ||
       (local_58.m.ptr == (QAbstractItemModel *)0x0)) {
      if (local_78.m.ptr == (QAbstractItemModel *)0x0 || bVar11) goto LAB_0056dd76;
      pQVar8 = &local_78;
    }
    else if (local_78.m.ptr == (QAbstractItemModel *)0x0 || bVar11) {
      pQVar8 = &local_58;
    }
    else {
      pQVar8 = &local_58;
    }
    QItemSelection::select((QModelIndex *)__return_storage_ptr__,pQVar8);
  }
LAB_0056dd76:
  if (local_98 != (QArrayData *)0x0) {
    LOCK();
    (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_98,0x18,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QItemSelection QListViewPrivate::selection(const QRect &rect) const
{
    QItemSelection selection;
    QModelIndex tl, br;
    const QList<QModelIndex> intersectVector = intersectingSet(rect);
    QList<QModelIndex>::const_iterator it = intersectVector.begin();
    for (; it != intersectVector.end(); ++it) {
        if (!tl.isValid() && !br.isValid()) {
            tl = br = *it;
        } else if ((*it).row() == (tl.row() - 1)) {
            tl = *it; // expand current range
        } else if ((*it).row() == (br.row() + 1)) {
            br = (*it); // expand current range
        } else {
            selection.select(tl, br); // select current range
            tl = br = *it; // start new range
        }
    }

    if (tl.isValid() && br.isValid())
        selection.select(tl, br);
    else if (tl.isValid())
        selection.select(tl, tl);
    else if (br.isValid())
        selection.select(br, br);

    return selection;
}